

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool Catch::operator==(ReporterSpec *lhs,ReporterSpec *rhs)

{
  size_t __n;
  ColourMode *pCVar1;
  ColourMode *pCVar2;
  bool bVar3;
  int iVar4;
  
  __n = (lhs->m_name)._M_string_length;
  if ((__n == (rhs->m_name)._M_string_length) &&
     (((__n == 0 ||
       (iVar4 = bcmp((lhs->m_name)._M_dataplus._M_p,(rhs->m_name)._M_dataplus._M_p,__n), iVar4 == 0)
       ) && (bVar3 = operator==(&lhs->m_outputFileName,&rhs->m_outputFileName), bVar3)))) {
    pCVar1 = (lhs->m_colourMode).nullableValue;
    pCVar2 = (rhs->m_colourMode).nullableValue;
    if (pCVar2 == (ColourMode *)0x0 || pCVar1 == (ColourMode *)0x0) {
      if (pCVar1 != (ColourMode *)0x0 || pCVar2 != (ColourMode *)0x0) {
        return false;
      }
    }
    else if (*pCVar1 != *pCVar2) {
      return false;
    }
    if ((lhs->m_customOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (rhs->m_customOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      bVar3 = std::__equal<false>::
              equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        ((lhs->m_customOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                         ,(_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )&(lhs->m_customOptions)._M_t._M_impl.super__Rb_tree_header,
                         (rhs->m_customOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                        );
      return bVar3;
    }
  }
  return false;
}

Assistant:

void Capturer::captureValue( size_t index, std::string const& value ) {
        assert( index < m_messages.size() );
        m_messages[index].message += value;
        m_resultCapture.pushScopedMessage( m_messages[index] );
        m_captured++;
    }